

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O3

string * __thiscall
vkt::tessellation::anon_unknown_1::IOBlock::glslTraverseBasicType
          (string *__return_storage_ptr__,IOBlock *this,int indentationDepth,
          BasicTypeVisitFunc visit)

{
  pointer pcVar1;
  string *psVar2;
  long *plVar3;
  size_type *psVar4;
  long lVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ostringstream result;
  long *local_218 [2];
  long local_208 [2];
  string local_1f8;
  string local_1d8;
  string *local_1b8;
  BasicTypeVisitFunc local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1b8 = __return_storage_ptr__;
  local_1b0 = visit;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  if (0 < (int)((ulong)((long)(this->m_members).
                              super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_members).
                             super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249) {
    lVar5 = 0x20;
    lVar6 = 0;
    do {
      local_218[0] = local_208;
      pcVar1 = (this->m_interfaceName)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_218,pcVar1,pcVar1 + (this->m_interfaceName)._M_string_length);
      std::__cxx11::string::append((char *)local_218);
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_218,
                                  *(ulong *)((long)(this->m_members).
                                                                                                      
                                                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                            lVar5 + -0x20));
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_1f8.field_2._M_allocated_capacity = *psVar4;
        local_1f8.field_2._8_8_ = plVar3[3];
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      }
      else {
        local_1f8.field_2._M_allocated_capacity = *psVar4;
        local_1f8._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_1f8._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      glslTraverseBasicTypes
                (&local_1d8,&local_1f8,
                 (VarType *)
                 ((long)&(((this->m_members).
                           super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                           ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                 lVar5),0,indentationDepth,local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if (local_218[0] != local_208) {
        operator_delete(local_218[0],local_208[0] + 1);
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x38;
    } while (lVar6 < (int)((ulong)((long)(this->m_members).
                                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->m_members).
                                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x49249249);
  }
  psVar2 = local_1b8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string IOBlock::glslTraverseBasicType (const int indentationDepth, BasicTypeVisitFunc visit) const
{
	std::ostringstream result;
	for (int i = 0; i < static_cast<int>(m_members.size()); ++i)
		result << glslTraverseBasicTypes(m_interfaceName + "." + m_members[i].name, m_members[i].type, 0, indentationDepth, visit);
	return result.str();
}